

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.h
# Opt level: O3

O3DGCErrorCode __thiscall o3dgc::TriangleFans::AddTFAN(TriangleFans *this)

{
  ulong uVar1;
  long *__src;
  long *__dest;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = this->m_numTFANs;
  if (-1 < (long)uVar1) {
    lVar4 = uVar1 + 1;
    this->m_numTFANs = lVar4;
    if (lVar4 == this->m_sizeTFANAllocatedSize) {
      this->m_sizeTFANAllocatedSize = lVar4 * 2;
      __src = this->m_sizeTFAN;
      uVar3 = 0xffffffffffffffff;
      if (uVar1 < 0xfffffffffffffff) {
        uVar3 = lVar4 * 0x10;
      }
      __dest = (long *)operator_new__(uVar3);
      this->m_sizeTFAN = __dest;
      memcpy(__dest,__src,lVar4 * 8);
      if (__src != (long *)0x0) {
        operator_delete__(__src);
        lVar4 = this->m_numTFANs;
      }
    }
    if (lVar4 < 2) {
      lVar2 = 0;
    }
    else {
      lVar2 = this->m_sizeTFAN[lVar4 + -2];
    }
    this->m_sizeTFAN[lVar4 + -1] = lVar2;
    return O3DGC_OK;
  }
  __assert_fail("m_numTFANs >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                ,0xec,"O3DGCErrorCode o3dgc::TriangleFans::AddTFAN()");
}

Assistant:

O3DGCErrorCode                AddTFAN()
                                    {
                                        assert(m_numTFANs >= 0);
                                        ++m_numTFANs;
                                        if (m_numTFANs == m_sizeTFANAllocatedSize)
                                        {
                                            m_sizeTFANAllocatedSize *= 2;
                                            long * tmp = m_sizeTFAN;
                                            m_sizeTFAN = new long [m_sizeTFANAllocatedSize];
                                            memcpy(m_sizeTFAN, tmp, sizeof(long) * m_numTFANs);
                                            delete [] tmp;
                                        }
                                        m_sizeTFAN[m_numTFANs-1] = (m_numTFANs > 1) ? m_sizeTFAN[m_numTFANs-2] : 0;
                                        return O3DGC_OK;
                                    }